

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O3

int xmlSchemaCheckDerivationOKRestriction2to4
              (xmlSchemaParserCtxtPtr pctxt,int action,xmlSchemaBasicItemPtr item,
              xmlSchemaBasicItemPtr baseItem,xmlSchemaItemListPtr uses,xmlSchemaItemListPtr baseUses
              ,xmlSchemaWildcardPtr wild,xmlSchemaWildcardPtr baseWild)

{
  xmlSchemaAttributeUsePtr_conflict attruse;
  xmlSchemaAttributePtr pxVar1;
  void *pvVar2;
  long lVar3;
  xmlSchemaParserCtxtPtr pxVar4;
  xmlSchemaBasicItemPtr pxVar5;
  int iVar6;
  xmlNodePtr node;
  xmlChar *pxVar7;
  xmlChar *pxVar8;
  xmlChar *pxVar9;
  xmlSchemaWildcardNsPtr pxVar10;
  xmlSchemaWildcardNsPtr pxVar11;
  long lVar12;
  char *str3;
  char *pcVar13;
  long lVar14;
  xmlChar *local_80;
  int local_74;
  xmlSchemaParserCtxtPtr local_70;
  xmlSchemaBasicItemPtr local_68;
  xmlSchemaBasicItemPtr local_60;
  xmlChar *local_58;
  xmlNodePtr local_50;
  xmlChar *local_48;
  xmlChar *local_40;
  xmlNodePtr local_38;
  
  local_74 = action;
  local_70 = pctxt;
  local_68 = item;
  local_60 = baseItem;
  if ((uses != (xmlSchemaItemListPtr)0x0) && (0 < uses->nbItems)) {
    local_48 = "redefined";
    if (action == 0) {
      local_48 = "base";
    }
    lVar14 = 0;
    do {
      pxVar5 = local_68;
      attruse = (xmlSchemaAttributeUsePtr_conflict)uses->items[lVar14];
      if ((baseUses != (xmlSchemaItemListPtr)0x0) && (0 < (long)baseUses->nbItems)) {
        pxVar1 = attruse->attrDecl;
        lVar12 = 0;
        do {
          pvVar2 = baseUses->items[lVar12];
          lVar3 = *(long *)((long)pvVar2 + 0x18);
          if ((pxVar1->name == *(xmlChar **)(lVar3 + 0x10)) &&
             (pxVar1->targetNamespace == *(xmlChar **)(lVar3 + 0x70))) {
            if ((attruse->occurs == 2) && (*(int *)((long)pvVar2 + 0x30) == 1)) {
              local_80 = (xmlChar *)0x0;
              local_50 = xmlSchemaGetComponentNode(local_68);
              pxVar7 = xmlSchemaGetComponentDesignation(&local_80,local_60);
              xmlSchemaPAttrUseErr4
                        (local_70,XML_SCHEMAP_DERIVATION_OK_RESTRICTION_2_1_1,local_50,pxVar5,
                         attruse,
                         "The \'optional\' attribute use is inconsistent with the corresponding \'required\' attribute use of the %s %s"
                         ,local_48,pxVar7,(xmlChar *)0x0,(xmlChar *)0x0);
              pxVar7 = local_80;
            }
            else {
              iVar6 = xmlSchemaCheckCOSSTDerivedOK
                                ((xmlSchemaAbstractCtxtPtr)local_70,pxVar1->subtypes,
                                 *(xmlSchemaTypePtr *)(lVar3 + 0x60),0);
              if (iVar6 == 0) goto LAB_001c6090;
              local_80 = (xmlChar *)0x0;
              local_58 = (xmlChar *)0x0;
              local_40 = (xmlChar *)0x0;
              local_38 = xmlSchemaGetComponentNode(local_68);
              local_50 = (xmlNodePtr)
                         xmlSchemaGetComponentDesignation(&local_80,attruse->attrDecl->subtypes);
              pxVar7 = xmlSchemaGetComponentDesignation
                                 (&local_58,*(void **)(*(long *)((long)pvVar2 + 0x18) + 0x60));
              pxVar8 = xmlSchemaGetComponentDesignation(&local_40,local_60);
              xmlSchemaPAttrUseErr4
                        (local_70,XML_SCHEMAP_DERIVATION_OK_RESTRICTION_2_1_2,local_38,local_68,
                         attruse,
                         "The attribute declaration\'s %s is not validly derived from the corresponding %s of the attribute declaration in the %s %s"
                         ,(xmlChar *)local_50,pxVar7,local_48,pxVar8);
              if (local_80 != (xmlChar *)0x0) {
                (*xmlFree)(local_80);
              }
              pxVar7 = local_40;
              if (local_58 != (xmlChar *)0x0) {
                (*xmlFree)(local_58);
                pxVar7 = local_40;
              }
            }
            if (pxVar7 != (xmlChar *)0x0) {
              (*xmlFree)(pxVar7);
            }
            goto LAB_001c6090;
          }
          lVar12 = lVar12 + 1;
        } while (baseUses->nbItems != lVar12);
      }
      if ((baseWild == (xmlSchemaWildcardPtr)0x0) ||
         (iVar6 = xmlSchemaCheckCVCWildcardNamespace(baseWild,attruse->attrDecl->targetNamespace),
         iVar6 != 0)) {
        pxVar5 = local_68;
        local_80 = (xmlChar *)0x0;
        node = xmlSchemaGetComponentNode(local_68);
        pxVar7 = xmlSchemaGetComponentDesignation(&local_80,local_60);
        xmlSchemaPAttrUseErr4
                  (local_70,XML_SCHEMAP_DERIVATION_OK_RESTRICTION_2_2,node,pxVar5,attruse,
                   "Neither a matching attribute use, nor a matching wildcard exists in the %s %s",
                   local_48,pxVar7,(xmlChar *)0x0,(xmlChar *)0x0);
        if (local_80 != (xmlChar *)0x0) {
          (*xmlFree)(local_80);
        }
      }
LAB_001c6090:
      lVar14 = lVar14 + 1;
    } while (lVar14 < uses->nbItems);
  }
  if ((baseUses != (xmlSchemaItemListPtr)0x0) && (iVar6 = baseUses->nbItems, 0 < iVar6)) {
    pxVar7 = "redefined";
    if (local_74 == 0) {
      pxVar7 = "base";
    }
    lVar14 = 0;
    do {
      pvVar2 = baseUses->items[lVar14];
      if (*(int *)((long)pvVar2 + 0x30) == 1) {
        if ((uses != (xmlSchemaItemListPtr)0x0) && (0 < (long)uses->nbItems)) {
          lVar12 = 0;
          do {
            lVar3 = *(long *)((long)uses->items[lVar12] + 0x18);
            if ((*(long *)(lVar3 + 0x10) == *(long *)(*(long *)((long)pvVar2 + 0x18) + 0x10)) &&
               (*(long *)(lVar3 + 0x70) == *(long *)(*(long *)((long)pvVar2 + 0x18) + 0x70)))
            goto LAB_001c6313;
            lVar12 = lVar12 + 1;
          } while (uses->nbItems != lVar12);
        }
        local_80 = (xmlChar *)0x0;
        local_58 = (xmlChar *)0x0;
        pxVar8 = xmlSchemaGetComponentDesignation(&local_80,pvVar2);
        pxVar9 = xmlSchemaGetComponentDesignation(&local_58,local_60);
        xmlSchemaCustomErr4((xmlSchemaAbstractCtxtPtr)local_70,
                            XML_SCHEMAP_DERIVATION_OK_RESTRICTION_3,(xmlNodePtr)0x0,local_68,
                            "A matching attribute use for the \'required\' %s of the %s %s is missing"
                            ,pxVar8,pxVar7,pxVar9,(xmlChar *)0x0);
        if (local_80 != (xmlChar *)0x0) {
          (*xmlFree)(local_80);
        }
        if (local_58 != (xmlChar *)0x0) {
          (*xmlFree)(local_58);
        }
        iVar6 = baseUses->nbItems;
      }
LAB_001c6313:
      lVar14 = lVar14 + 1;
    } while (lVar14 < iVar6);
  }
  pxVar5 = local_60;
  pxVar4 = local_70;
  if (wild == (xmlSchemaWildcardPtr)0x0) {
    return 0;
  }
  if (baseWild == (xmlSchemaWildcardPtr)0x0) {
    local_80 = (xmlChar *)0x0;
    if (local_68->type == XML_SCHEMA_TYPE_BASIC) {
      pcVar13 = "simple type definition";
      if (local_68[10].type == 0x2d) {
        pcVar13 = "complex type definition";
      }
    }
    else {
      pcVar13 = (char *)xmlSchemaItemTypeToStr(local_68->type);
    }
    pxVar4 = local_70;
    pxVar7 = "redefined";
    if (local_74 == 0) {
      pxVar7 = "base";
    }
    if (pxVar5->type == XML_SCHEMA_TYPE_BASIC) {
      str3 = "simple type definition";
      if (pxVar5[10].type == 0x2d) {
        str3 = "complex type definition";
      }
    }
    else {
      str3 = (char *)xmlSchemaItemTypeToStr(pxVar5->type);
    }
    pxVar8 = xmlSchemaGetComponentQName(&local_80,pxVar5);
    xmlSchemaCustomErr4((xmlSchemaAbstractCtxtPtr)pxVar4,XML_SCHEMAP_DERIVATION_OK_RESTRICTION_4_1,
                        (xmlNodePtr)0x0,local_68,
                        "The %s has an attribute wildcard, but the %s %s \'%s\' does not have one",
                        (xmlChar *)pcVar13,pxVar7,(xmlChar *)str3,pxVar8);
    if (local_80 != (xmlChar *)0x0) {
      (*xmlFree)(local_80);
    }
    return pxVar4->err;
  }
  if ((baseWild->any == 0) &&
     (((wild->negNsSet == (xmlSchemaWildcardNsPtr)0x0 ||
       (baseWild->negNsSet == (xmlSchemaWildcardNsPtr)0x0)) ||
      (wild->negNsSet->value != baseWild->negNsSet->value)))) {
    pxVar10 = wild->nsSet;
    if (pxVar10 == (xmlSchemaWildcardNsPtr)0x0) {
LAB_001c659b:
      local_80 = (xmlChar *)0x0;
      pxVar7 = "redefined";
      if (local_74 == 0) {
        pxVar7 = "base";
      }
      if (local_60->type == XML_SCHEMA_TYPE_BASIC) {
        pcVar13 = "simple type definition";
        if (local_60[10].type == 0x2d) {
          pcVar13 = "complex type definition";
        }
      }
      else {
        pcVar13 = (char *)xmlSchemaItemTypeToStr(local_60->type);
      }
      pxVar8 = xmlSchemaGetComponentQName(&local_80,pxVar5);
      xmlSchemaCustomErr4((xmlSchemaAbstractCtxtPtr)pxVar4,XML_SCHEMAP_DERIVATION_OK_RESTRICTION_4_2
                          ,(xmlNodePtr)0x0,local_68,
                          "The attribute wildcard is not a valid subset of the wildcard in the %s %s \'%s\'"
                          ,pxVar7,(xmlChar *)pcVar13,pxVar8,(xmlChar *)0x0);
      if (local_80 != (xmlChar *)0x0) {
        (*xmlFree)(local_80);
      }
      return pxVar4->err;
    }
    if (baseWild->nsSet == (xmlSchemaWildcardNsPtr)0x0) {
      if (baseWild->negNsSet == (xmlSchemaWildcardNsPtr)0x0) goto LAB_001c659b;
      do {
        if (pxVar10->value == baseWild->negNsSet->value) goto LAB_001c659b;
        pxVar10 = pxVar10->next;
      } while (pxVar10 != (_xmlSchemaWildcardNs *)0x0);
    }
    else {
      pxVar11 = (xmlSchemaWildcardNsPtr)&baseWild->nsSet;
      do {
        pxVar11 = pxVar11->next;
        if (pxVar11 == (xmlSchemaWildcardNsPtr)0x0) goto LAB_001c659b;
      } while ((pxVar10->value != pxVar11->value) ||
              (pxVar10 = pxVar10->next, pxVar11 = (xmlSchemaWildcardNsPtr)&baseWild->nsSet,
              pxVar10 != (_xmlSchemaWildcardNs *)0x0));
    }
  }
  if (local_60->type == XML_SCHEMA_TYPE_BASIC) {
    if (local_60[10].type == 0x2d) {
      return 0;
    }
    if (baseWild->processContents <= wild->processContents) {
      return 0;
    }
    local_80 = (xmlChar *)0x0;
    pxVar7 = "redefined";
    if (local_74 == 0) {
      pxVar7 = "base";
    }
    pxVar8 = "simple type definition";
  }
  else {
    if (baseWild->processContents <= wild->processContents) {
      return 0;
    }
    local_80 = (xmlChar *)0x0;
    pxVar7 = "redefined";
    if (local_74 == 0) {
      pxVar7 = "base";
    }
    pxVar8 = xmlSchemaItemTypeToStr(local_60->type);
  }
  pxVar9 = xmlSchemaGetComponentQName(&local_80,pxVar5);
  xmlSchemaCustomErr4((xmlSchemaAbstractCtxtPtr)local_70,XML_SCHEMAP_DERIVATION_OK_RESTRICTION_4_3,
                      (xmlNodePtr)0x0,pxVar5,
                      "The {process contents} of the attribute wildcard is weaker than the one in the %s %s \'%s\'"
                      ,pxVar7,pxVar8,pxVar9,(xmlChar *)0x0);
  if (local_80 != (xmlChar *)0x0) {
    (*xmlFree)(local_80);
  }
  return local_70->err;
}

Assistant:

static int
xmlSchemaCheckDerivationOKRestriction2to4(xmlSchemaParserCtxtPtr pctxt,
				       int action,
				       xmlSchemaBasicItemPtr item,
				       xmlSchemaBasicItemPtr baseItem,
				       xmlSchemaItemListPtr uses,
				       xmlSchemaItemListPtr baseUses,
				       xmlSchemaWildcardPtr wild,
				       xmlSchemaWildcardPtr baseWild)
{
    xmlSchemaAttributeUsePtr cur = NULL, bcur;
    int i, j, found; /* err = 0; */
    const xmlChar *bEffValue;
    int effFixed;

    if (uses != NULL) {
	for (i = 0; i < uses->nbItems; i++) {
	    cur = uses->items[i];
	    found = 0;
	    if (baseUses == NULL)
		goto not_found;
	    for (j = 0; j < baseUses->nbItems; j++) {
		bcur = baseUses->items[j];
		if ((WXS_ATTRUSE_DECL_NAME(cur) ==
			WXS_ATTRUSE_DECL_NAME(bcur)) &&
		    (WXS_ATTRUSE_DECL_TNS(cur) ==
			WXS_ATTRUSE_DECL_TNS(bcur)))
		{
		    /*
		    * (2.1) "If there is an attribute use in the {attribute
		    * uses} of the {base type definition} (call this B) whose
		    * {attribute declaration} has the same {name} and {target
		    * namespace}, then  all of the following must be true:"
		    */
		    found = 1;

		    if ((cur->occurs == XML_SCHEMAS_ATTR_USE_OPTIONAL) &&
			(bcur->occurs == XML_SCHEMAS_ATTR_USE_REQUIRED))
		    {
			xmlChar *str = NULL;
			/*
			* (2.1.1) "one of the following must be true:"
			* (2.1.1.1) "B's {required} is false."
			* (2.1.1.2) "R's {required} is true."
			*/
			xmlSchemaPAttrUseErr4(pctxt,
			    XML_SCHEMAP_DERIVATION_OK_RESTRICTION_2_1_1,
			    WXS_ITEM_NODE(item), item, cur,
			    "The 'optional' attribute use is inconsistent "
			    "with the corresponding 'required' attribute use of "
			    "the %s %s",
			    WXS_ACTION_STR(action),
			    xmlSchemaGetComponentDesignation(&str, baseItem),
			    NULL, NULL);
			FREE_AND_NULL(str);
			/* err = pctxt->err; */
		    } else if (xmlSchemaCheckCOSSTDerivedOK(ACTXT_CAST pctxt,
			WXS_ATTRUSE_TYPEDEF(cur),
			WXS_ATTRUSE_TYPEDEF(bcur), 0) != 0)
		    {
			xmlChar *strA = NULL, *strB = NULL, *strC = NULL;

			/*
			* SPEC (2.1.2) "R's {attribute declaration}'s
			* {type definition} must be validly derived from
			* B's {type definition} given the empty set as
			* defined in Type Derivation OK (Simple) ($3.14.6)."
			*/
			xmlSchemaPAttrUseErr4(pctxt,
			    XML_SCHEMAP_DERIVATION_OK_RESTRICTION_2_1_2,
			    WXS_ITEM_NODE(item), item, cur,
			    "The attribute declaration's %s "
			    "is not validly derived from "
			    "the corresponding %s of the "
			    "attribute declaration in the %s %s",
			    xmlSchemaGetComponentDesignation(&strA,
				WXS_ATTRUSE_TYPEDEF(cur)),
			    xmlSchemaGetComponentDesignation(&strB,
				WXS_ATTRUSE_TYPEDEF(bcur)),
			    WXS_ACTION_STR(action),
			    xmlSchemaGetComponentDesignation(&strC, baseItem));
			    /* xmlSchemaGetComponentDesignation(&str, baseItem), */
			FREE_AND_NULL(strA);
			FREE_AND_NULL(strB);
			FREE_AND_NULL(strC);
			/* err = pctxt->err; */
		    } else {
			/*
			* 2.1.3 [Definition:]  Let the effective value
			* constraint of an attribute use be its {value
			* constraint}, if present, otherwise its {attribute
			* declaration}'s {value constraint} .
			*/
			xmlSchemaGetEffectiveValueConstraint(bcur,
			    &effFixed, &bEffValue, NULL);
			/*
			* 2.1.3 ... one of the following must be true
			*
			* 2.1.3.1 B's `effective value constraint` is
			* `absent` or default.
			*/
			if ((bEffValue != NULL) &&
			    (effFixed == 1)) {
			    const xmlChar *rEffValue = NULL;

			    xmlSchemaGetEffectiveValueConstraint(bcur,
				&effFixed, &rEffValue, NULL);
			    /*
			    * 2.1.3.2 R's `effective value constraint` is
			    * fixed with the same string as B's.
			    * MAYBE TODO: Compare the computed values.
			    *       Hmm, it says "same string" so
			    *       string-equality might really be sufficient.
			    */
			    if ((effFixed == 0) ||
				(! WXS_ARE_DEFAULT_STR_EQUAL(rEffValue, bEffValue)))
			    {
				xmlChar *str = NULL;

				xmlSchemaPAttrUseErr4(pctxt,
				    XML_SCHEMAP_DERIVATION_OK_RESTRICTION_2_1_3,
				    WXS_ITEM_NODE(item), item, cur,
				    "The effective value constraint of the "
				    "attribute use is inconsistent with "
				    "its correspondent in the %s %s",
				    WXS_ACTION_STR(action),
				    xmlSchemaGetComponentDesignation(&str,
					baseItem),
				    NULL, NULL);
				FREE_AND_NULL(str);
				/* err = pctxt->err; */
			    }
			}
		    }
		    break;
		}
	    }
not_found:
	    if (!found) {
		/*
		* (2.2) "otherwise the {base type definition} must have an
		* {attribute wildcard} and the {target namespace} of the
		* R's {attribute declaration} must be `valid` with respect
		* to that wildcard, as defined in Wildcard allows Namespace
		* Name ($3.10.4)."
		*/
		if ((baseWild == NULL) ||
		    (xmlSchemaCheckCVCWildcardNamespace(baseWild,
		    (WXS_ATTRUSE_DECL(cur))->targetNamespace) != 0))
		{
		    xmlChar *str = NULL;

		    xmlSchemaPAttrUseErr4(pctxt,
			XML_SCHEMAP_DERIVATION_OK_RESTRICTION_2_2,
			WXS_ITEM_NODE(item), item, cur,
			"Neither a matching attribute use, "
			"nor a matching wildcard exists in the %s %s",
			WXS_ACTION_STR(action),
			xmlSchemaGetComponentDesignation(&str, baseItem),
			NULL, NULL);
		    FREE_AND_NULL(str);
		    /* err = pctxt->err; */
		}
	    }
	}
    }
    /*
    * SPEC derivation-ok-restriction (3):
    * (3) "For each attribute use in the {attribute uses} of the {base type
    * definition} whose {required} is true, there must be an attribute
    * use with an {attribute declaration} with the same {name} and
    * {target namespace} as its {attribute declaration} in the {attribute
    * uses} of the complex type definition itself whose {required} is true.
    */
    if (baseUses != NULL) {
	for (j = 0; j < baseUses->nbItems; j++) {
	    bcur = baseUses->items[j];
	    if (bcur->occurs != XML_SCHEMAS_ATTR_USE_REQUIRED)
		continue;
	    found = 0;
	    if (uses != NULL) {
		for (i = 0; i < uses->nbItems; i++) {
		    cur = uses->items[i];
		    if ((WXS_ATTRUSE_DECL_NAME(cur) ==
			WXS_ATTRUSE_DECL_NAME(bcur)) &&
			(WXS_ATTRUSE_DECL_TNS(cur) ==
			WXS_ATTRUSE_DECL_TNS(bcur))) {
			found = 1;
			break;
		    }
		}
	    }
	    if (!found) {
		xmlChar *strA = NULL, *strB = NULL;

		xmlSchemaCustomErr4(ACTXT_CAST pctxt,
		    XML_SCHEMAP_DERIVATION_OK_RESTRICTION_3,
		    NULL, item,
		    "A matching attribute use for the "
		    "'required' %s of the %s %s is missing",
		    xmlSchemaGetComponentDesignation(&strA, bcur),
		    WXS_ACTION_STR(action),
		    xmlSchemaGetComponentDesignation(&strB, baseItem),
		    NULL);
		FREE_AND_NULL(strA);
		FREE_AND_NULL(strB);
	    }
	}
    }
    /*
    * derivation-ok-restriction (4)
    */
    if (wild != NULL) {
	/*
	* (4) "If there is an {attribute wildcard}, all of the
	* following must be true:"
	*/
	if (baseWild == NULL) {
	    xmlChar *str = NULL;

	    /*
	    * (4.1) "The {base type definition} must also have one."
	    */
	    xmlSchemaCustomErr4(ACTXT_CAST pctxt,
		XML_SCHEMAP_DERIVATION_OK_RESTRICTION_4_1,
		NULL, item,
		"The %s has an attribute wildcard, "
		"but the %s %s '%s' does not have one",
		WXS_ITEM_TYPE_NAME(item),
		WXS_ACTION_STR(action),
		WXS_ITEM_TYPE_NAME(baseItem),
		xmlSchemaGetComponentQName(&str, baseItem));
	    FREE_AND_NULL(str);
	    return(pctxt->err);
	} else if ((baseWild->any == 0) &&
		xmlSchemaCheckCOSNSSubset(wild, baseWild))
	{
	    xmlChar *str = NULL;
	    /*
	    * (4.2) "The complex type definition's {attribute wildcard}'s
	    * {namespace constraint} must be a subset of the {base type
	    * definition}'s {attribute wildcard}'s {namespace constraint},
	    * as defined by Wildcard Subset ($3.10.6)."
	    */
	    xmlSchemaCustomErr4(ACTXT_CAST pctxt,
		XML_SCHEMAP_DERIVATION_OK_RESTRICTION_4_2,
		NULL, item,
		"The attribute wildcard is not a valid "
		"subset of the wildcard in the %s %s '%s'",
		WXS_ACTION_STR(action),
		WXS_ITEM_TYPE_NAME(baseItem),
		xmlSchemaGetComponentQName(&str, baseItem),
		NULL);
	    FREE_AND_NULL(str);
	    return(pctxt->err);
	}
	/* 4.3 Unless the {base type definition} is the `ur-type
	* definition`, the complex type definition's {attribute
	* wildcard}'s {process contents} must be identical to or
	* stronger than the {base type definition}'s {attribute
	* wildcard}'s {process contents}, where strict is stronger
	* than lax is stronger than skip.
	*/
	if ((! WXS_IS_ANYTYPE(baseItem)) &&
	    (wild->processContents < baseWild->processContents)) {
	    xmlChar *str = NULL;
	    xmlSchemaCustomErr4(ACTXT_CAST pctxt,
		XML_SCHEMAP_DERIVATION_OK_RESTRICTION_4_3,
		NULL, baseItem,
		"The {process contents} of the attribute wildcard is "
		"weaker than the one in the %s %s '%s'",
		WXS_ACTION_STR(action),
		WXS_ITEM_TYPE_NAME(baseItem),
		xmlSchemaGetComponentQName(&str, baseItem),
		NULL);
	    FREE_AND_NULL(str)
		return(pctxt->err);
	}
    }
    return(0);
}